

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O3

void open_sockets(sender *s,string *host)

{
  int iVar1;
  io_buf *piVar2;
  
  iVar1 = open_socket((host->_M_dataplus)._M_p);
  s->sd = iVar1;
  piVar2 = (io_buf *)operator_new(0xa8);
  piVar2->_vptr_io_buf = (_func_int **)&PTR_open_file_002d00c0;
  (piVar2->space)._begin = (char *)0x0;
  (piVar2->space)._end = (char *)0x0;
  (piVar2->space).end_array = (char *)0x0;
  (piVar2->space).erase_count = 0;
  (piVar2->files)._begin = (int *)0x0;
  (piVar2->files)._end = (int *)0x0;
  (piVar2->files).end_array = (int *)0x0;
  (piVar2->files).erase_count = 0;
  (piVar2->currentname)._begin = (char *)0x0;
  (piVar2->currentname)._end = (char *)0x0;
  (piVar2->currentname).end_array = (char *)0x0;
  (piVar2->currentname).erase_count = 0;
  (piVar2->finalname)._begin = (char *)0x0;
  (piVar2->finalname)._end = (char *)0x0;
  (piVar2->finalname).end_array = (char *)0x0;
  (piVar2->finalname).erase_count = 0;
  v_array<char>::resize(&piVar2->space,0x10000);
  piVar2->count = 0;
  piVar2->current = 0;
  piVar2->head = (piVar2->space)._begin;
  piVar2->_verify_hash = false;
  piVar2->_hash = 0;
  s->buf = piVar2;
  v_array<int>::push_back(&piVar2->files,&s->sd);
  return;
}

Assistant:

void open_sockets(sender& s, string host)
{
  s.sd = open_socket(host.c_str());
  s.buf = new io_buf();
  s.buf->files.push_back(s.sd);
}